

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
ModbusSimulationDataGenerator::SendGeneric2Response
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U8 FuncCode,U8 ByteCount,U16 *Values)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  ModbusSimulationDataGenerator *pMVar7;
  ModbusSimulationDataGenerator *this_00;
  U64 value;
  
  if (this->mSettings->mModbusMode == ModbusRTUServer) {
    CreateModbusByte(this,(ulong)DeviceID);
    uVar6 = (int)this + 0x30;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    CreateModbusByte(this,(ulong)FuncCode);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    CreateModbusByte(this,(ulong)ByteCount);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    if (1 < ByteCount) {
      uVar4 = 0;
      do {
        CreateModbusByte(this,(ulong)(byte)Values[uVar4]);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        SimulationChannelDescriptor::Advance(uVar6);
        CreateModbusByte(this,(ulong)*(byte *)((long)Values + uVar4 * 2 + 1));
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        SimulationChannelDescriptor::Advance(uVar6);
        uVar4 = uVar4 + 1;
      } while (ByteCount >> 1 != uVar4);
    }
    uVar2 = this->crc_tab16[(byte)~((byte)this->crc_tab16[(byte)~DeviceID] ^ FuncCode)] >> 8 ^
            this->crc_tab16
            [(byte)((byte)(this->crc_tab16[(byte)~DeviceID] >> 8) ^
                    (byte)this->crc_tab16
                          [(byte)~((byte)this->crc_tab16[(byte)~DeviceID] ^ FuncCode)] ^ ByteCount)]
    ;
    if (1 < ByteCount) {
      uVar4 = 0;
      do {
        uVar2 = this->crc_tab16[(uVar2 ^ Values[uVar4]) & 0xff] >> 8 ^
                this->crc_tab16
                [(ushort)((uVar2 ^ Values[uVar4]) >> 8 ^
                         this->crc_tab16[(uVar2 ^ Values[uVar4]) & 0xff]) & 0xff];
        uVar4 = uVar4 + 1;
      } while (ByteCount >> 1 != uVar4);
    }
    CreateModbusByte(this,(ulong)uVar2 & 0xff);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    value = (U64)(uVar2 >> 8);
  }
  else {
    sVar3 = (ushort)FuncCode + (ushort)DeviceID + (ushort)ByteCount;
    cVar5 = (char)sVar3;
    if (1 < ByteCount) {
      uVar4 = 0;
      do {
        sVar3 = (Values[uVar4] >> 8) + sVar3 + Values[uVar4];
        cVar5 = (char)sVar3;
        uVar4 = uVar4 + 1;
      } while (ByteCount >> 1 != uVar4);
    }
    CreateModbusByte(this,0x3a);
    this_00 = (ModbusSimulationDataGenerator *)&this->mModbusSimulationData;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    uVar6 = (uint)this_00;
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar6);
    bVar1 = BinToLATIN1(pMVar7,DeviceID >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar6);
    bVar1 = BinToLATIN1(pMVar7,DeviceID & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar6);
    bVar1 = BinToLATIN1(pMVar7,FuncCode >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar6);
    bVar1 = BinToLATIN1(pMVar7,FuncCode & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar6);
    bVar1 = BinToLATIN1(pMVar7,ByteCount >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar6);
    bVar1 = BinToLATIN1(pMVar7,ByteCount & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar6);
    if (1 < ByteCount) {
      uVar4 = 0;
      do {
        bVar1 = BinToLATIN1(pMVar7,(byte)(Values[uVar4] >> 0xc));
        CreateModbusByte(this,(ulong)bVar1);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar7 = this_00;
        SimulationChannelDescriptor::Advance(uVar6);
        bVar1 = BinToLATIN1(pMVar7,*(byte *)((long)Values + uVar4 * 2 + 1) & 0xf);
        CreateModbusByte(this,(ulong)bVar1);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar7 = this_00;
        SimulationChannelDescriptor::Advance(uVar6);
        bVar1 = BinToLATIN1(pMVar7,(byte)Values[uVar4] >> 4);
        CreateModbusByte(this,(ulong)bVar1);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar7 = this_00;
        SimulationChannelDescriptor::Advance(uVar6);
        bVar1 = BinToLATIN1(pMVar7,(byte)Values[uVar4] & 0xf);
        CreateModbusByte(this,(ulong)bVar1);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar7 = this_00;
        SimulationChannelDescriptor::Advance(uVar6);
        uVar4 = uVar4 + 1;
      } while (ByteCount >> 1 != uVar4);
    }
    bVar1 = BinToLATIN1(pMVar7,(byte)-cVar5 >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    bVar1 = BinToLATIN1(this_00,-cVar5 & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    value = 10;
  }
  CreateModbusByte(this,value);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance((int)this + 0x30);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendGeneric2Response( U8 DeviceID, U8 FuncCode, U8 ByteCount, U16 Values[] )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUServer )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( FuncCode );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ByteCount );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        for( int i = 0; i < ByteCount / 2; i++ )
        {
            CreateModbusByte( Values[ i ] & 0x00FF );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

            CreateModbusByte( ( Values[ i ] & 0xFF00 ) >> 8 );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
        }

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, FuncCode );
        CRCValue = update_CRC( CRCValue, ByteCount );

        for( int i = 0; i < ByteCount / 2; i++ )
        {
            CRCValue = update_CRC( CRCValue, Values[ i ] & 0x00FF );
            CRCValue = update_CRC( CRCValue, ( Values[ i ] & 0xFF00 ) >> 8 );
        }

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + FuncCode;
        LRCvalue = LRCvalue + ByteCount;

        for( int i = 0; i < ByteCount / 2; i++ )
        {
            LRCvalue = LRCvalue + Values[ i ] & 0x00FF;
            LRCvalue = LRCvalue + ( ( Values[ i ] & 0xFF00 ) >> 8 );
        }

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FuncCode >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( FuncCode & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ByteCount & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ByteCount & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        for( int i = 0; i < ByteCount / 2; i++ )
        {
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF000 ) >> 12 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0x0F00 ) >> 8 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF0 ) >> 4 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( Values[ i ] & 0xF ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        }

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}